

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

size_t gnuplotio::
       get_range_size<gnuplotio::PairOfRange<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::IteratorRange<int_const*,int>>>
                 (PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
                  *arg)

{
  bool bVar1;
  undefined1 local_38 [8];
  PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
  i;
  size_t ret;
  PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
  *arg_local;
  
  i.r.end = (int *)0x0;
  local_38 = (undefined1  [8])(arg->l).it;
  i.l.it = (arg->l).end;
  i.l.end = (arg->r).it;
  i.r.it = (arg->r).end;
  while( true ) {
    bVar1 = PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
            ::is_end((PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
                      *)local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    i.r.end = (int *)((long)i.r.end + 1);
    PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
    ::inc((PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
           *)local_38);
  }
  return (size_t)i.r.end;
}

Assistant:

size_t get_range_size(const T &arg) {
    // FIXME - not the fastest way.  Implement a size() method for range.
    size_t ret = 0;
    for(T i=arg; !i.is_end(); i.inc()) ++ret;
    return ret;
}